

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O1

bool LoadNodes(FileReader *lump)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ushort *puVar5;
  node_t *pnVar6;
  ushort *puVar7;
  anon_union_32_2_9298864e_for_node_t_4 *paVar8;
  long lVar9;
  undefined1 *__s;
  uint uVar10;
  ushort *puVar11;
  anon_union_32_2_9298864e_for_node_t_4 *paVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uStack_50;
  short asStack_48 [4];
  ulong local_40;
  ushort *local_38;
  
  if (format5 == '\0') {
    numnodes = (int)((ulong)lump->Length / 0x1c);
    if (numnodes == 0) {
      return false;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)numnodes;
    uVar4 = SUB168(auVar2 * ZEXT816(0x48),0);
    if (SUB168(auVar2 * ZEXT816(0x48),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    uStack_50 = 0x3fb06f;
    nodes = (node_t *)operator_new__(uVar4);
    local_40 = 0;
    uStack_50 = 0x3fb08e;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0,0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)numnodes;
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x1c),8) == 0) {
      uVar4 = SUB168(auVar3 * ZEXT816(0x1c),0);
    }
    uStack_50 = 0x3fb0a6;
    puVar5 = (ushort *)operator_new__(uVar4);
    uStack_50 = 0x3fb0b9;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,puVar5,lump->Length);
    lVar9 = (long)numnodes;
    lVar13 = -(lVar9 * 2 + 0xfU & 0xfffffffffffffff0);
    __s = (undefined1 *)((long)asStack_48 + lVar13);
    *(undefined8 *)((long)asStack_48 + lVar13 + -8) = 0x3fb0e0;
    memset(__s,0,lVar9 * 2);
    bVar14 = true;
    if (0 < lVar9) {
      puVar7 = puVar5 + 4;
      paVar8 = &nodes->field_4;
      local_38 = puVar5;
      pnVar6 = nodes;
      do {
        pnVar6->x = (uint)*puVar5 << 0x10;
        pnVar6->y = (uint)puVar5[1] << 0x10;
        pnVar6->dx = (uint)puVar5[2] << 0x10;
        pnVar6->dy = (uint)puVar5[3] << 0x10;
        paVar12 = paVar8;
        puVar11 = puVar7;
        lVar13 = 0;
        do {
          uVar10 = (uint)puVar5[lVar13 + 0xc];
          if ((short)puVar5[lVar13 + 0xc] < 0) {
            if (numsubsectors <= (int)(uVar10 & 0x7fff)) goto LAB_003fb204;
            *(ulong *)((long)&pnVar6->field_6 + lVar13 * 8) =
                 (long)&subsectors->sector + (ulong)((uVar10 & 0x7fff) * 0x30) + 1;
          }
          else {
            if ((numnodes <= (int)uVar10) || (*(short *)(__s + (ulong)uVar10 * 2) != 0))
            goto LAB_003fb204;
            *(ulong *)((long)&pnVar6->field_6 + lVar13 * 8) =
                 (long)&nodes->x + (ulong)(uVar10 * 0x48);
            *(short *)(__s + (ulong)uVar10 * 2) = (short)lVar13 + 1;
          }
          lVar9 = 0;
          do {
            *(float *)((long)paVar12 + lVar9 * 4) = (float)(int)(short)puVar11[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          puVar11 = puVar11 + 4;
          paVar12 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar12 + 0x10);
          bVar15 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar15);
        uVar10 = (int)local_40 + 1;
        pnVar6 = pnVar6 + 1;
        puVar5 = puVar5 + 0xe;
        puVar7 = puVar7 + 0xe;
        paVar8 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar8 + 0x48);
        local_40 = (ulong)uVar10;
        puVar11 = local_38;
      } while ((int)uVar10 < numnodes);
      goto LAB_003fb215;
    }
  }
  else {
    numnodes = (int)((ulong)lump->Length >> 5);
    if (numnodes == 0) {
      return false;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)numnodes;
    uVar4 = SUB168(auVar1 * ZEXT816(0x48),0);
    if (SUB168(auVar1 * ZEXT816(0x48),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    uStack_50 = 0x3fae93;
    nodes = (node_t *)operator_new__(uVar4);
    local_40 = 0;
    uStack_50 = 0x3faeb2;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0,0);
    uVar4 = (long)numnodes << 5;
    if ((long)numnodes < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    uStack_50 = 0x3faec9;
    puVar5 = (ushort *)operator_new__(uVar4);
    uStack_50 = 0x3faedc;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,puVar5,lump->Length);
    lVar9 = (long)numnodes;
    lVar13 = -(lVar9 * 2 + 0xfU & 0xfffffffffffffff0);
    __s = (undefined1 *)((long)asStack_48 + lVar13);
    *(undefined8 *)((long)asStack_48 + lVar13 + -8) = 0x3faf03;
    memset(__s,0,lVar9 * 2);
    bVar14 = true;
    if (0 < lVar9) {
      puVar7 = puVar5 + 4;
      paVar8 = &nodes->field_4;
      local_38 = puVar5;
      pnVar6 = nodes;
      do {
        pnVar6->x = *(int *)puVar5 << 0x10;
        pnVar6->y = (uint)puVar5[1] << 0x10;
        pnVar6->dx = *(int *)(puVar5 + 2) << 0x10;
        pnVar6->dy = (uint)puVar5[3] << 0x10;
        paVar12 = paVar8;
        puVar11 = puVar7;
        lVar13 = 0;
        do {
          uVar10 = *(uint *)(puVar5 + lVar13 * 2 + 0xc);
          uVar4 = (ulong)uVar10;
          if ((int)uVar10 < 0) {
            if (numsubsectors <= (int)(uVar10 & 0x7fffffff)) goto LAB_003fb204;
            *(undefined1 **)((long)&pnVar6->field_6 + lVar13 * 8) =
                 (undefined1 *)((long)&subsectors[uVar10 & 0x7fffffff].sector + 1);
          }
          else {
            if ((numnodes <= (int)uVar10) || (*(short *)(__s + uVar4 * 2) != 0)) goto LAB_003fb204;
            *(node_t **)((long)&pnVar6->field_6 + lVar13 * 8) = nodes + uVar4;
            *(short *)(__s + uVar4 * 2) = (short)lVar13 + 1;
          }
          lVar9 = 0;
          do {
            *(float *)((long)paVar12 + lVar9 * 4) = (float)(int)(short)puVar11[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          puVar11 = puVar11 + 4;
          paVar12 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar12 + 0x10);
          bVar15 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar15);
        uVar10 = (int)local_40 + 1;
        pnVar6 = pnVar6 + 1;
        puVar5 = puVar5 + 0x10;
        puVar7 = puVar7 + 0x10;
        paVar8 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar8 + 0x48);
        local_40 = (ulong)uVar10;
        puVar11 = local_38;
      } while ((int)uVar10 < numnodes);
      goto LAB_003fb215;
    }
  }
  bVar14 = true;
  puVar11 = puVar5;
  goto LAB_003fb215;
LAB_003fb204:
  bVar14 = false;
  puVar11 = local_38;
LAB_003fb215:
  *(undefined8 *)(__s + -8) = 0x3fb21a;
  operator_delete__(puVar11);
  return bVar14;
}

Assistant:

static bool LoadNodes (FileReader * lump)
{
	const int NF_SUBSECTOR = 0x8000;
	const int GL5_NF_SUBSECTOR = (1 << 31);

	int 		i;
	int 		j;
	int 		k;
	node_t* 	no;
	WORD*		used;

	if (!format5)
	{
		mapnode_t*	mn, * basemn;
		numnodes = lump->GetLength() / sizeof(mapnode_t);

		if (numnodes == 0) return false;

		nodes = new node_t[numnodes];		
		lump->Seek(0, SEEK_SET);

		basemn = mn = new mapnode_t[numnodes];
		lump->Read(mn, lump->GetLength());

		used = (WORD *)alloca (sizeof(WORD)*numnodes);
		memset (used, 0, sizeof(WORD)*numnodes);

		no = nodes;

		for (i = 0; i < numnodes; i++, no++, mn++)
		{
			no->x = LittleShort(mn->x)<<FRACBITS;
			no->y = LittleShort(mn->y)<<FRACBITS;
			no->dx = LittleShort(mn->dx)<<FRACBITS;
			no->dy = LittleShort(mn->dy)<<FRACBITS;
			for (j = 0; j < 2; j++)
			{
				WORD child = LittleShort(mn->children[j]);
				if (child & NF_SUBSECTOR)
				{
					child &= ~NF_SUBSECTOR;
					if (child >= numsubsectors)
					{
						delete [] basemn;
						return false;
					}
					no->children[j] = (BYTE *)&subsectors[child] + 1;
				}
				else if (child >= numnodes)
				{
					delete [] basemn;
					return false;
				}
				else if (used[child])
				{
					delete [] basemn;
					return false;
				}
				else
				{
					no->children[j] = &nodes[child];
					used[child] = j + 1;
				}
				for (k = 0; k < 4; k++)
				{
					no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
				}
			}
		}
		delete [] basemn;
	}
	else
	{
		gl5_mapnode_t*	mn, * basemn;
		numnodes = lump->GetLength() / sizeof(gl5_mapnode_t);

		if (numnodes == 0) return false;

		nodes = new node_t[numnodes];		
		lump->Seek(0, SEEK_SET);

		basemn = mn = new gl5_mapnode_t[numnodes];
		lump->Read(mn, lump->GetLength());

		used = (WORD *)alloca (sizeof(WORD)*numnodes);
		memset (used, 0, sizeof(WORD)*numnodes);

		no = nodes;

		for (i = 0; i < numnodes; i++, no++, mn++)
		{
			no->x = LittleShort(mn->x)<<FRACBITS;
			no->y = LittleShort(mn->y)<<FRACBITS;
			no->dx = LittleShort(mn->dx)<<FRACBITS;
			no->dy = LittleShort(mn->dy)<<FRACBITS;
			for (j = 0; j < 2; j++)
			{
				SDWORD child = LittleLong(mn->children[j]);
				if (child & GL5_NF_SUBSECTOR)
				{
					child &= ~GL5_NF_SUBSECTOR;
					if (child >= numsubsectors)
					{
						delete [] basemn;
						return false;
					}
					no->children[j] = (BYTE *)&subsectors[child] + 1;
				}
				else if (child >= numnodes)
				{
					delete [] basemn;
					return false;
				}
				else if (used[child])
				{
					delete [] basemn;
					return false;
				}
				else
				{
					no->children[j] = &nodes[child];
					used[child] = j + 1;
				}
				for (k = 0; k < 4; k++)
				{
					no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
				}
			}
		}
		delete [] basemn;
	}
	return true;
}